

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

HRESULT Js::ParseableFunctionInfo::MapDeferredReparseError
                  (HRESULT *hrParse,CompileScriptException *se)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  if (*hrParse == -0x7999bffc) {
    iVar2 = (se->super_ScriptException).ei.scode;
    bVar1 = false;
    if (iVar2 < -0x7ff5ffe4) {
      if (iVar2 != -0x7fffbffc) {
        if (iVar2 != -0x7ff8fff2) {
          bVar3 = iVar2 == -0x7ff5fff9;
          goto LAB_0076aeb7;
        }
        goto LAB_0076aebe;
      }
    }
    else if ((iVar2 != -0x7ff5ffe4) && (iVar2 != -0x7ff5ebe4)) {
      bVar3 = iVar2 == -0x7ff5fc17;
LAB_0076aeb7:
      iVar2 = 0;
      if (!bVar3) goto LAB_0076aec5;
      goto LAB_0076aebe;
    }
  }
  else {
    bVar1 = false;
    iVar2 = 0;
    if (*hrParse != -0x7ff8fff2) goto LAB_0076aec5;
LAB_0076aebe:
    iVar2 = -0x7ff8fff2;
  }
  bVar1 = true;
LAB_0076aec5:
  if (bVar1) {
    *hrParse = 0;
  }
  return iVar2;
}

Assistant:

HRESULT ParseableFunctionInfo::MapDeferredReparseError(HRESULT& hrParse, const CompileScriptException& se)
    {
        HRESULT hrMapped = NO_ERROR;

        switch (hrParse)
        {
        case E_OUTOFMEMORY:
            hrMapped = E_OUTOFMEMORY;
            break;

        case SCRIPT_E_RECORDED:
            switch (se.ei.scode)
            {
            case ERRnoMemory:
            case E_OUTOFMEMORY:
            case VBSERR_OutOfMemory:
                hrMapped = E_OUTOFMEMORY;
                break;

            case VBSERR_OutOfStack:
                hrMapped = VBSERR_OutOfStack;
                break;

            case JSERR_AsmJsCompileError:
                hrMapped = JSERR_AsmJsCompileError;
                break;

            case E_ABORT:
                hrMapped = E_ABORT;
                break;
            }
        }

        if (FAILED(hrMapped))
        {
            // If we have mapped error, clear hrParse. We'll throw error from hrMapped.
            hrParse = NO_ERROR;
        }

        return hrMapped;
    }